

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::GetTargetSets
          (cmGlobalGenerator *this,TargetDependSet *projectTargets,TargetDependSet *originalTargets,
          cmLocalGenerator *root,GeneratorVector *generators)

{
  cmGlobalGenerator *target;
  bool bVar1;
  cmLocalGenerator *pcVar2;
  cmGlobalGenerator *pcVar3;
  cmGlobalGenerator *this_00;
  pointer ppcVar4;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> tgts;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  GeneratorVector *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  ppcVar4 = (generators->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  this_00 = this;
  local_48 = generators;
  if (ppcVar4 !=
      (generators->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      bVar1 = IsExcluded(this_00,root,*ppcVar4);
      if (!bVar1) {
        this_00 = (cmGlobalGenerator *)local_60;
        std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                  ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)this_00,
                   &(*ppcVar4)->GeneratorTargets);
        pcVar3 = (cmGlobalGenerator *)local_60._0_8_;
        if (local_60._0_8_ != local_60._8_8_) {
          do {
            target = (cmGlobalGenerator *)
                     (((_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                      &pcVar3->_vptr_cmGlobalGenerator)->_M_impl).super__Vector_impl_data._M_start;
            bVar1 = IsRootOnlyTarget(this,(cmGeneratorTarget *)target);
            if ((!bVar1) ||
               (this_00 = target,
               pcVar2 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)target),
               pcVar2 == root)) {
              local_40._8_2_ = 0;
              local_40._M_allocated_capacity = (size_type)target;
              std::
              _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
              ::_M_insert_unique<cmTargetDepend>
                        ((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                          *)originalTargets,(cmTargetDepend *)&local_40);
              this_00 = this;
              AddTargetDepends(this,(cmGeneratorTarget *)target,projectTargets);
            }
            pcVar3 = (cmGlobalGenerator *)&pcVar3->TryCompileTimeout;
          } while (pcVar3 != (cmGlobalGenerator *)local_60._8_8_);
        }
        generators = local_48;
        if ((cmGlobalGenerator *)local_60._0_8_ != (cmGlobalGenerator *)0x0) {
          this_00 = (cmGlobalGenerator *)local_60._0_8_;
          operator_delete((void *)local_60._0_8_,(long)local_50._M_p - local_60._0_8_);
          generators = local_48;
        }
      }
      ppcVar4 = ppcVar4 + 1;
    } while (ppcVar4 !=
             (generators->
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmGlobalGenerator::GetTargetSets(TargetDependSet& projectTargets,
                                      TargetDependSet& originalTargets,
                                      cmLocalGenerator* root,
                                      GeneratorVector const& generators)
{
  // loop over all local generators
  for (std::vector<cmLocalGenerator*>::const_iterator i = generators.begin();
       i != generators.end(); ++i) {
    // check to make sure generator is not excluded
    if (this->IsExcluded(root, *i)) {
      continue;
    }
    // Get the targets in the makefile
    std::vector<cmGeneratorTarget*> tgts = (*i)->GetGeneratorTargets();
    // loop over all the targets
    for (std::vector<cmGeneratorTarget*>::iterator l = tgts.begin();
         l != tgts.end(); ++l) {
      cmGeneratorTarget* target = *l;
      if (this->IsRootOnlyTarget(target) &&
          target->GetLocalGenerator() != root) {
        continue;
      }
      // put the target in the set of original targets
      originalTargets.insert(target);
      // Get the set of targets that depend on target
      this->AddTargetDepends(target, projectTargets);
    }
  }
}